

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O1

bool Assimp::PLY::DOM::ParseInstance
               (IOStreamBuffer<char> *streamBuffer,DOM *p_pcOut,PLYImporter *loader)

{
  Logger *pLVar1;
  vector<char,_std::allocator<char>_> buffer;
  vector<char,_std::allocator<char>_> local_38;
  
  if (p_pcOut == (DOM *)0x0) {
    __assert_fail("__null != p_pcOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Ply/PlyParser.cpp"
                  ,0x281,
                  "static bool Assimp::PLY::DOM::ParseInstance(IOStreamBuffer<char> &, DOM *, PLYImporter *)"
                 );
  }
  if (loader != (PLYImporter *)0x0) {
    local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    IOStreamBuffer<char>::getNextLine(streamBuffer,&local_38);
    pLVar1 = DefaultLogger::get();
    Logger::debug(pLVar1,"PLY::DOM::ParseInstance() begin");
    ParseHeader(p_pcOut,streamBuffer,&local_38,false);
    IOStreamBuffer<char>::getNextLine(streamBuffer,&local_38);
    ParseElementInstanceLists(p_pcOut,streamBuffer,&local_38,loader);
    pLVar1 = DefaultLogger::get();
    Logger::debug(pLVar1,"PLY::DOM::ParseInstance() succeeded");
    if (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return true;
  }
  __assert_fail("__null != loader",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Ply/PlyParser.cpp"
                ,0x282,
                "static bool Assimp::PLY::DOM::ParseInstance(IOStreamBuffer<char> &, DOM *, PLYImporter *)"
               );
}

Assistant:

bool PLY::DOM::ParseInstance(IOStreamBuffer<char> &streamBuffer, DOM* p_pcOut, PLYImporter* loader)
{
  ai_assert(NULL != p_pcOut);
  ai_assert(NULL != loader);

  std::vector<char> buffer;
  streamBuffer.getNextLine(buffer);

  ASSIMP_LOG_DEBUG("PLY::DOM::ParseInstance() begin");

  if (!p_pcOut->ParseHeader(streamBuffer, buffer, false))
  {
      ASSIMP_LOG_DEBUG("PLY::DOM::ParseInstance() failure");
    return false;
  }

  //get next line after header
  streamBuffer.getNextLine(buffer);
  if (!p_pcOut->ParseElementInstanceLists(streamBuffer, buffer, loader))
  {
      ASSIMP_LOG_DEBUG("PLY::DOM::ParseInstance() failure");
    return false;
  }
  ASSIMP_LOG_DEBUG("PLY::DOM::ParseInstance() succeeded");
  return true;
}